

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O0

void __thiscall
Saturation::PredicateSplitPassiveClauseContainer::simulationInit
          (PredicateSplitPassiveClauseContainer *this)

{
  bool bVar1;
  pointer pPVar2;
  __normal_iterator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_*,_std::vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>_>
  *in_RDI;
  unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
  *queue;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  *__range1_1;
  uint *balance;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  *in_stack_ffffffffffffffa8;
  value_type_conflict *in_stack_ffffffffffffffb8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_*,_std::vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>_>
  local_38;
  __normal_iterator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_*,_std::vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>_>
  *local_30;
  reference local_28;
  uint *local_20;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_18;
  __normal_iterator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_*,_std::vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>_>
  *local_10;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xac9d5f);
  local_10 = in_RDI + 0x19;
  local_18._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_ffffffffffffffa8);
  local_20 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_RDI,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    local_28 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_18);
  }
  local_30 = in_RDI + 0x10;
  local_38._M_current =
       (unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
        *)std::
          vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
          ::begin(in_stack_ffffffffffffffa8);
  std::
  vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_*,_std::vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>_>
                               *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_*,_std::vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>_>
    ::operator*(&local_38);
    pPVar2 = std::
             unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
             ::operator->((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                           *)0xac9e2f);
    (*(pPVar2->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer[7])();
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_*,_std::vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void PredicateSplitPassiveClauseContainer::simulationInit()
{
  _simulationBalances.clear();
  for (const auto& balance : _balances)
  {
    _simulationBalances.push_back(balance);
  }

  for (const auto& queue : _queues)
  {
    queue->simulationInit();
  }
}